

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

void __thiscall
iDynTree::MatrixDynSize::MatrixDynSize
          (MatrixDynSize *this,double *in_data,size_t in_rows,size_t in_cols)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__MatrixDynSize_00852c28;
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  if (in_RDI[2] * in_RDI[3] == 0) {
    in_RDI[1] = 0;
    in_RDI[4] = 0;
  }
  else {
    in_RDI[4] = in_RDI[2] * in_RDI[3];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI[4];
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
    memcpy((void *)in_RDI[1],in_RSI,in_RDX * in_RCX * 8);
  }
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(const double* in_data,
                             const std::size_t in_rows,
                             const std::size_t in_cols): m_rows(in_rows),
                                                          m_cols(in_cols)
{
    if( this->m_rows*this->m_cols == 0 )
    {
        this->m_data = 0;
        this->m_capacity = 0;
    }
    else
    {
        this->m_capacity = this->m_rows*this->m_cols;
        this->m_data = new double[this->m_capacity];
        std::memcpy(this->m_data,in_data,in_rows*in_cols*sizeof(double));
    }
}